

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O0

void Imf_2_5::Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(IStream *in,uint *v)

{
  IStream *in_RSI;
  uchar b [4];
  undefined4 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffec;
  undefined1 in_stack_ffffffffffffffed;
  undefined1 in_stack_ffffffffffffffee;
  undefined1 in_stack_ffffffffffffffef;
  
  readUnsignedChars<Imf_2_5::StreamIO,Imf_2_5::IStream>
            (in_RSI,(uchar *)CONCAT17(in_stack_ffffffffffffffef,
                                      CONCAT16(in_stack_ffffffffffffffee,
                                               CONCAT15(in_stack_ffffffffffffffed,
                                                        CONCAT14(in_stack_ffffffffffffffec,
                                                                 in_stack_ffffffffffffffe8)))),0);
  *(uint *)&in_RSI->_vptr_IStream =
       CONCAT13(in_stack_ffffffffffffffef,
                CONCAT12(in_stack_ffffffffffffffee,
                         CONCAT11(in_stack_ffffffffffffffed,in_stack_ffffffffffffffec)));
  return;
}

Assistant:

void
read (T &in, unsigned int &v)
{
    unsigned char b[4];

    readUnsignedChars<S> (in, b, 4);

    v =  (b[0]        & 0x000000ff) |
	((b[1] << 8)  & 0x0000ff00) |
	((b[2] << 16) & 0x00ff0000) |
	 (b[3] << 24);
}